

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O3

ostream * lambda::operator<<(std::ostream&,lambda::Ast_const&)::helper::rec(std::ostream&,lambda::
          Ast_const&,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::
          allocator<std::basic_string_view<char,std::char_traits<char>_>_>_>__
                    (ostream *os,Ast *ast,Context *ctxt)

{
  variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>
  *pvVar1;
  long lVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  undefined8 *puVar4;
  Overload<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:125:11),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:128:11),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:129:11),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:134:11)>
  local_38;
  
  pvVar1 = (ast->underlying_).
           super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar2 = (long)(char)(pvVar1->
                      super__Variant_base<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>
                      ).
                      super__Move_assign_alias<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>
                      .
                      super__Copy_assign_alias<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>
                      .
                      super__Move_ctor_alias<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>
                      .
                      super__Copy_ctor_alias<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>
                      .
                      super__Variant_storage_alias<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>
                      ._M_index;
  local_38.super_anon_class_16_2_514ea2a2.os = os;
  local_38.super_anon_class_16_2_514ea2a2.ctxt = ctxt;
  local_38.
  super_Overload<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:128:11),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:129:11),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:134:11)>
  .super_anon_class_8_1_3fcf66a2.os = os;
  local_38.
  super_Overload<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:128:11),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:129:11),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:134:11)>
  .
  super_Overload<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:129:11),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:134:11)>
  .super_anon_class_16_2_514ea2a2.os = os;
  local_38.
  super_Overload<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:128:11),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:129:11),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:134:11)>
  .
  super_Overload<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:129:11),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:134:11)>
  .super_anon_class_16_2_514ea2a2.ctxt = ctxt;
  local_38.
  super_Overload<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:128:11),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:129:11),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:134:11)>
  .
  super_Overload<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:129:11),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:134:11)>
  .
  super_Overload<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:134:11)>
  .super_anon_class_16_2_514ea2a2.os = os;
  local_38.
  super_Overload<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:128:11),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:129:11),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:134:11)>
  .
  super_Overload<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:129:11),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:134:11)>
  .
  super_Overload<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:134:11)>
  .super_anon_class_16_2_514ea2a2.ctxt = ctxt;
  if (lVar2 != -1) {
    pbVar3 = (*std::__detail::__variant::
               __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::basic_ostream<char,_std::char_traits<char>_>_&>,_ublib::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/strega-nil[P]lambda/source/lambda/ast.cpp:125:11),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/strega-nil[P]lambda/source/lambda/ast.cpp:128:11),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/strega-nil[P]lambda/source/lambda/ast.cpp:129:11),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/strega-nil[P]lambda/source/lambda/ast.cpp:134:11)>_&&,_const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>_&>
               ::_S_vtable._M_arr[lVar2]._M_data)(&local_38,pvVar1);
    return pbVar3;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar4 = &PTR__exception_00109b68;
  puVar4[1] = "std::visit: variant is valueless";
  __cxa_throw(puVar4,&std::bad_variant_access::typeinfo,std::exception::~exception);
}

Assistant:

static std::ostream& rec(std::ostream& os, Ast const& ast, Context& ctxt) {
      return ublib::match(ast)(
          [&](Ast::Variable const& e) -> std::ostream& {
            return os << ctxt.at(e.index()) << '_' << e.index();
          },
          [&](Ast::Free_variable const& e) -> std::ostream& { return os << e.name(); },
          [&](Ast::Call const& e) -> std::ostream& {
            rec(os, e.callee(), ctxt);
            os << ' ';
            return rec(os, e.argument(), ctxt);
          },
          [&](Ast::Lambda const& e) -> std::ostream& {
            os << "(/" << e.variable() << '.';
            ctxt.push_back(e.variable());
            rec(os, e.expression(), ctxt);
            ctxt.pop_back();
            return os << ')';
          });
    }